

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::
FilteredIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Kernel::EqHelper::IsNonVariable,_false>
::hasNext(FilteredIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Kernel::EqHelper::IsNonVariable,_false>
          *this)

{
  bool bVar1;
  long in_RDI;
  _ElementType next;
  TypedTermList *in_stack_ffffffffffffff78;
  TermList in_stack_ffffffffffffff80;
  Option<Kernel::TypedTermList> *this_00;
  __doDeletion<false> local_6d [13];
  TypedTermList local_60;
  Option<Kernel::TypedTermList> local_50;
  uint64_t local_38;
  TypedTermList local_30;
  TypedTermList local_20;
  bool local_1;
  
  bVar1 = OptionBase<Kernel::TypedTermList>::isSome
                    ((OptionBase<Kernel::TypedTermList> *)(in_RDI + 0x10));
  if (bVar1) {
    local_1 = true;
  }
  else {
    while (bVar1 = VirtualIterator<Kernel::TypedTermList>::hasNext
                             ((VirtualIterator<Kernel::TypedTermList> *)0x853412), bVar1) {
      local_30 = VirtualIterator<Kernel::TypedTermList>::next
                           ((VirtualIterator<Kernel::TypedTermList> *)0x853429);
      local_20 = move_if_value<Kernel::TypedTermList,_true>(&local_30);
      local_38 = local_20.super_TermList._content;
      bVar1 = Kernel::EqHelper::IsNonVariable::operator()
                        ((IsNonVariable *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
      if (bVar1) {
        local_60 = move_if_value<Kernel::TypedTermList,_true>(&local_20);
        this_00 = &local_50;
        Option<Kernel::TypedTermList>::OptionBase(this_00,in_stack_ffffffffffffff78);
        Option<Kernel::TypedTermList>::operator=
                  (this_00,(Option<Kernel::TypedTermList> *)in_stack_ffffffffffffff78);
        Option<Kernel::TypedTermList>::~Option((Option<Kernel::TypedTermList> *)0x8534ad);
        return true;
      }
      __doDeletion<false>::operator()
                (local_6d,(VirtualIterator<Kernel::TypedTermList> *)(in_RDI + 8));
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }